

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O1

void __thiscall
icu_63::CanonicalIterator::setSource
          (CanonicalIterator *this,UnicodeString *newSource,UErrorCode *status)

{
  size_t s;
  short sVar1;
  UBool UVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined8 *puVar6;
  long *plVar7;
  UnicodeString **ppUVar8;
  int32_t *piVar9;
  UnicodeString *pUVar10;
  long lVar11;
  UnicodeString *pUVar12;
  int32_t iVar13;
  int32_t offset;
  UnicodeString *p;
  UMemory *this_00;
  UnicodeString *pUVar14;
  int iVar15;
  long lVar16;
  
  pUVar12 = &this->source;
  p = newSource;
  (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,newSource,pUVar12);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  this->done = '\0';
  cleanPieces(this);
  sVar1 = (newSource->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (newSource->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 == 0) {
    ppUVar8 = (UnicodeString **)uprv_malloc_63(8);
    this->pieces = ppUVar8;
    piVar9 = (int32_t *)uprv_malloc_63(4);
    this->pieces_lengths = piVar9;
    this->pieces_length = 1;
    piVar9 = (int32_t *)uprv_malloc_63(4);
    this->current = piVar9;
    this->current_length = 1;
    pUVar14 = (UnicodeString *)0x0;
    if (((piVar9 != (int32_t *)0x0) &&
        (pUVar14 = (UnicodeString *)0x0, this->pieces != (UnicodeString **)0x0)) &&
       (this->pieces_lengths != (int32_t *)0x0)) {
      *piVar9 = 0;
      puVar6 = (undefined8 *)UMemory::operator_new__((UMemory *)0x48,(size_t)p);
      if (puVar6 == (undefined8 *)0x0) {
        pUVar12 = (UnicodeString *)0x0;
      }
      else {
        *puVar6 = 1;
        pUVar12 = (UnicodeString *)(puVar6 + 1);
        puVar6[1] = &PTR__UnicodeString_003b5258;
        *(undefined2 *)(puVar6 + 2) = 2;
      }
      *this->pieces = pUVar12;
      *this->pieces_lengths = 1;
      if (*this->pieces != (UnicodeString *)0x0) {
        return;
      }
      pUVar14 = (UnicodeString *)0x0;
    }
  }
  else {
    sVar1 = (this->source).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->source).fUnion.fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    lVar16 = (long)iVar3 * 0x40;
    this_00 = (UMemory *)0xffffffffffffffff;
    if (-1 < iVar3) {
      this_00 = (UMemory *)(lVar16 + 8);
    }
    plVar7 = (long *)UMemory::operator_new__(this_00,(size_t)p);
    if (plVar7 == (long *)0x0) {
      pUVar14 = (UnicodeString *)0x0;
    }
    else {
      *plVar7 = (long)iVar3;
      pUVar14 = (UnicodeString *)(plVar7 + 1);
      if (iVar3 != 0) {
        lVar11 = 0;
        do {
          *(undefined ***)((long)plVar7 + lVar11 + 8) = &PTR__UnicodeString_003b5258;
          *(undefined2 *)((long)plVar7 + lVar11 + 0x10) = 2;
          lVar11 = lVar11 + 0x40;
        } while (lVar16 != lVar11);
      }
    }
    iVar3 = 0;
    if (pUVar14 == (UnicodeString *)0x0) {
      pUVar14 = (UnicodeString *)0x0;
    }
    else {
      uVar4 = UnicodeString::char32At(pUVar12,0);
      offset = 2 - (uint)(uVar4 < 0x10000);
      sVar1 = (this->source).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (this->source).fUnion.fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      iVar15 = 0;
      if (offset < iVar5) {
        iVar3 = 0;
        do {
          uVar4 = UnicodeString::char32At(pUVar12,offset);
          UVar2 = Normalizer2Impl::isCanonSegmentStarter(this->nfcImpl,uVar4);
          if (UVar2 != '\0') {
            sVar1 = pUVar14[iVar15].fUnion.fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar13 = pUVar14[iVar15].fUnion.fFields.fLength;
            }
            else {
              iVar13 = (int)sVar1 >> 5;
            }
            UnicodeString::doReplace(pUVar14 + iVar15,0,iVar13,pUVar12,iVar3,offset - iVar3);
            iVar15 = iVar15 + 1;
            iVar3 = offset;
          }
          sVar1 = (this->source).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (this->source).fUnion.fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          offset = (offset - (uint)(uVar4 < 0x10000)) + 2;
        } while (offset < iVar5);
      }
      lVar16 = (long)iVar15;
      sVar1 = pUVar14[lVar16].fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar13 = pUVar14[lVar16].fUnion.fFields.fLength;
      }
      else {
        iVar13 = (int)sVar1 >> 5;
      }
      p = (UnicodeString *)0x0;
      UnicodeString::doReplace(pUVar14 + lVar16,0,iVar13,pUVar12,iVar3,offset - iVar3);
      ppUVar8 = (UnicodeString **)uprv_malloc_63(lVar16 * 8 + 8);
      this->pieces = ppUVar8;
      this->pieces_length = iVar15 + 1;
      s = lVar16 * 4 + 4;
      piVar9 = (int32_t *)uprv_malloc_63(s);
      this->pieces_lengths = piVar9;
      piVar9 = (int32_t *)uprv_malloc_63(s);
      this->current = piVar9;
      this->current_length = iVar15 + 1;
      if (((this->pieces != (UnicodeString **)0x0) && (this->pieces_lengths != (int32_t *)0x0)) &&
         (piVar9 != (int32_t *)0x0)) {
        if (0 < (long)this->current_length) {
          p = (UnicodeString *)0x0;
          memset(piVar9,0,(long)this->current_length << 2);
        }
        if (0 < this->pieces_length) {
          lVar16 = 0;
          lVar11 = 0;
          pUVar12 = pUVar14;
          do {
            p = pUVar12;
            pUVar10 = getEquivalents(this,pUVar12,(int32_t *)((long)this->pieces_lengths + lVar16),
                                     status);
            *(UnicodeString **)((long)this->pieces + lVar16 * 2) = pUVar10;
            lVar11 = lVar11 + 1;
            lVar16 = lVar16 + 4;
            pUVar12 = pUVar12 + 1;
          } while (lVar11 < this->pieces_length);
        }
        lVar16 = *(long *)((long)&pUVar14[-1].fUnion + 0x30);
        if (lVar16 != 0) {
          lVar16 = lVar16 << 6;
          do {
            UnicodeString::~UnicodeString
                      ((UnicodeString *)
                       ((long)&pUVar14[-1].super_Replaceable.super_UObject._vptr_UObject + lVar16));
            lVar16 = lVar16 + -0x40;
          } while (lVar16 != 0);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar14[-1].fUnion + 0x30),p);
        return;
      }
    }
  }
  *status = U_MEMORY_ALLOCATION_ERROR;
  if (pUVar14 != (UnicodeString *)0x0) {
    lVar16 = *(long *)((long)&pUVar14[-1].fUnion + 0x30);
    if (lVar16 != 0) {
      lVar16 = lVar16 << 6;
      do {
        UnicodeString::~UnicodeString
                  ((UnicodeString *)
                   ((long)&pUVar14[-1].super_Replaceable.super_UObject._vptr_UObject + lVar16));
        lVar16 = lVar16 + -0x40;
      } while (lVar16 != 0);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar14[-1].fUnion + 0x30),p);
  }
  cleanPieces(this);
  return;
}

Assistant:

void CanonicalIterator::setSource(const UnicodeString &newSource, UErrorCode &status) {
    int32_t list_length = 0;
    UChar32 cp = 0;
    int32_t start = 0;
    int32_t i = 0;
    UnicodeString *list = NULL;

    nfd.normalize(newSource, source, status);
    if(U_FAILURE(status)) {
      return;
    }
    done = FALSE;

    cleanPieces();

    // catch degenerate case
    if (newSource.length() == 0) {
        pieces = (UnicodeString **)uprv_malloc(sizeof(UnicodeString *));
        pieces_lengths = (int32_t*)uprv_malloc(1 * sizeof(int32_t));
        pieces_length = 1;
        current = (int32_t*)uprv_malloc(1 * sizeof(int32_t));
        current_length = 1;
        if (pieces == NULL || pieces_lengths == NULL || current == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            goto CleanPartialInitialization;
        }
        current[0] = 0;
        pieces[0] = new UnicodeString[1];
        pieces_lengths[0] = 1;
        if (pieces[0] == 0) {
            status = U_MEMORY_ALLOCATION_ERROR;
            goto CleanPartialInitialization;
        }
        return;
    }


    list = new UnicodeString[source.length()];
    if (list == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto CleanPartialInitialization;
    }

    // i should initialy be the number of code units at the 
    // start of the string
    i = U16_LENGTH(source.char32At(0));
    //int32_t i = 1;
    // find the segments
    // This code iterates through the source string and 
    // extracts segments that end up on a codepoint that
    // doesn't start any decompositions. (Analysis is done
    // on the NFD form - see above).
    for (; i < source.length(); i += U16_LENGTH(cp)) {
        cp = source.char32At(i);
        if (nfcImpl.isCanonSegmentStarter(cp)) {
            source.extract(start, i-start, list[list_length++]); // add up to i
            start = i;
        }
    }
    source.extract(start, i-start, list[list_length++]); // add last one


    // allocate the arrays, and find the strings that are CE to each segment
    pieces = (UnicodeString **)uprv_malloc(list_length * sizeof(UnicodeString *));
    pieces_length = list_length;
    pieces_lengths = (int32_t*)uprv_malloc(list_length * sizeof(int32_t));
    current = (int32_t*)uprv_malloc(list_length * sizeof(int32_t));
    current_length = list_length;
    if (pieces == NULL || pieces_lengths == NULL || current == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto CleanPartialInitialization;
    }

    for (i = 0; i < current_length; i++) {
        current[i] = 0;
    }
    // for each segment, get all the combinations that can produce 
    // it after NFD normalization
    for (i = 0; i < pieces_length; ++i) {
        //if (PROGRESS) printf("SEGMENT\n");
        pieces[i] = getEquivalents(list[i], pieces_lengths[i], status);
    }

    delete[] list;
    return;
// Common section to cleanup all local variables and reset object variables.
CleanPartialInitialization:
    if (list != NULL) {
        delete[] list;
    }
    cleanPieces();
}